

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

void flexbuffers::AppendToString<flexbuffers::Vector>
               (string *s,Vector *v,bool keys_quoted,bool indented,int cur_indent,
               char *indent_string,bool natural_utf8)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  Reference local_40;
  
  std::__cxx11::string::append((char *)s);
  std::__cxx11::string::append((char *)s);
  if ((v->super_Sized).size_ != 0) {
    uVar4 = 0;
    do {
      if (uVar4 != 0) {
        std::__cxx11::string::append((char *)s);
        std::__cxx11::string::append((char *)s);
      }
      iVar3 = cur_indent;
      if (0 < cur_indent && indented) {
        do {
          std::__cxx11::string::append((char *)s);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      uVar2 = (v->super_Sized).size_;
      if (uVar4 < uVar2) {
        local_40.data_ = (v->super_Sized).super_Object.data_;
        local_40._8_8_ = ZEXT18((v->super_Sized).super_Object.byte_width_);
        bVar1 = local_40.data_[uVar4 + uVar2 * local_40._8_8_];
        local_40.data_ = local_40.data_ + uVar4 * local_40._8_8_;
        local_40._8_8_ = (1L << (bVar1 & 3)) << 8 | (ulong)(bVar1 >> 2) << 0x20 | local_40._8_8_;
      }
      else {
        local_40._8_8_ = 0x101;
        local_40.data_ = (uint8_t *)0x0;
      }
      Reference::ToString(&local_40,true,keys_quoted,s,indented,cur_indent,indent_string,
                          natural_utf8);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (v->super_Sized).size_);
  }
  if (indented) {
    std::__cxx11::string::append((char *)s);
    if (1 < cur_indent) {
      iVar3 = cur_indent + -1;
      do {
        std::__cxx11::string::append((char *)s);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  else {
    std::__cxx11::string::append((char *)s);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void AppendToString(std::string &s, T &&v, bool keys_quoted, bool indented,
                    int cur_indent, const char *indent_string,
                    bool natural_utf8) {
  s += "[";
  s += indented ? "\n" : " ";
  for (size_t i = 0; i < v.size(); i++) {
    if (i) {
      s += ",";
      s += indented ? "\n" : " ";
    }
    if (indented) IndentString(s, cur_indent, indent_string);
    v[i].ToString(true, keys_quoted, s, indented, cur_indent,
                  indent_string, natural_utf8);
  }
  if (indented) {
    s += "\n";
    IndentString(s, cur_indent - 1, indent_string);
  } else {
    s += " ";
  }
  s += "]";
}